

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O1

OneOf<kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::Done,_kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::Retry>
* __thiscall
kj::anon_unknown_123::AsyncPipe::BlockedWrite::tryReadImpl
          (OneOf<kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::Done,_kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::Retry>
           *__return_storage_ptr__,BlockedWrite *this,void *readBufferPtr,size_t minBytes,
          size_t maxBytes)

{
  size_t *psVar1;
  size_t sVar2;
  ArrayPtr<const_unsigned_char> *pAVar3;
  size_t sVar4;
  long lVar5;
  size_t n;
  ulong __n;
  ulong uVar6;
  size_t n_1;
  DebugExpression<bool> _kjCondition;
  undefined1 local_49;
  OneOf<kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::Done,_kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::Retry>
  *local_48;
  size_t local_40;
  Fault f;
  
  _kjCondition.value = (this->canceler).list.ptr == (AdapterBase *)0x0;
  if (!_kjCondition.value) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[16]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++"
               ,0x2c9,FAILED,"canceler.isEmpty()","_kjCondition,\"already pumping\"",&_kjCondition,
               (char (*) [16])"already pumping");
    kj::_::Debug::Fault::fatal(&f);
  }
  __n = (this->writeBuffer).size_;
  local_48 = __return_storage_ptr__;
  if (maxBytes < __n) {
    uVar6 = 0;
  }
  else {
    uVar6 = 0;
    local_40 = minBytes;
    do {
      memcpy(readBufferPtr,(this->writeBuffer).ptr,__n);
      uVar6 = uVar6 + __n;
      readBufferPtr = (void *)((long)readBufferPtr + __n);
      maxBytes = maxBytes - __n;
      sVar2 = (this->morePieces).size_;
      if (sVar2 == 0) {
        (*(this->fulfiller->super_PromiseRejector)._vptr_PromiseRejector[2])
                  (this->fulfiller,&local_49);
        if ((BlockedWrite *)(this->pipe->state).ptr == this) {
          (this->pipe->state).ptr = (AsyncCapabilityStream *)0x0;
        }
        if (local_40 < uVar6 || local_40 - uVar6 == 0) goto LAB_00493334;
        local_48->tag = 2;
        *(void **)&local_48->field_1 = readBufferPtr;
        *(size_t *)((long)&local_48->field_1 + 8) = local_40 - uVar6;
        *(size_t *)((long)&local_48->field_1 + 0x10) = maxBytes;
        lVar5 = 0x20;
        goto LAB_0049333f;
      }
      pAVar3 = (this->morePieces).ptr;
      sVar4 = pAVar3->size_;
      (this->writeBuffer).ptr = pAVar3->ptr;
      (this->writeBuffer).size_ = sVar4;
      (this->morePieces).ptr = pAVar3 + 1;
      (this->morePieces).size_ = sVar2 - 1;
      __n = (this->writeBuffer).size_;
    } while (__n <= maxBytes);
  }
  memcpy(readBufferPtr,(this->writeBuffer).ptr,maxBytes);
  (this->writeBuffer).ptr = (this->writeBuffer).ptr + maxBytes;
  psVar1 = &(this->writeBuffer).size_;
  *psVar1 = *psVar1 - maxBytes;
  uVar6 = uVar6 + maxBytes;
LAB_00493334:
  local_48->tag = 1;
  lVar5 = 8;
LAB_0049333f:
  *(ulong *)((long)&local_48->tag + lVar5) = uVar6;
  return local_48;
}

Assistant:

TwoWayPipe newTwoWayPipe() {
  auto pipe1 = kj::refcounted<AsyncPipe>();
  auto pipe2 = kj::refcounted<AsyncPipe>();
  auto end1 = kj::heap<TwoWayPipeEnd>(kj::addRef(*pipe1), kj::addRef(*pipe2));
  auto end2 = kj::heap<TwoWayPipeEnd>(kj::mv(pipe2), kj::mv(pipe1));
  return { { kj::mv(end1), kj::mv(end2) } };
}